

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::FindBlocks<unsigned_short,520>
               (unsigned_short *data,size_t length,double block_switch_bitcost,
               vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec,
               uint8_t *block_id)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  size_type sVar5;
  double *pdVar6;
  ulong uVar7;
  void *__s;
  const_reference pvVar8;
  void *__s_00;
  void *__s_01;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  byte local_b9;
  long lStack_b8;
  uint8_t cur_id;
  size_t ix;
  size_t byte_ix;
  size_t k_1;
  double block_switch_cost;
  size_t k;
  double min_cost;
  size_t insert_cost_ix;
  size_t ix_1;
  size_t byte_ix_1;
  bool *switch_signal;
  double *cost;
  size_t j_1;
  size_t i_1;
  size_t j;
  double *insert_cost;
  size_t vecsize;
  size_t i;
  uint8_t *block_id_local;
  vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec_local;
  double block_switch_bitcost_local;
  size_t length_local;
  unsigned_short *data_local;
  
  sVar5 = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::size(vec);
  if (sVar5 < 2) {
    for (vecsize = 0; vecsize < length; vecsize = vecsize + 1) {
      block_id[vecsize] = '\0';
    }
  }
  else {
    pdVar6 = (double *)
             std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::size
                       (vec);
    if ((double *)0x100 < pdVar6) {
      __assert_fail("vecsize <= 256",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/block_splitter.cc"
                    ,0xac,
                    "void brotli::FindBlocks(const DataType *, const size_t, const double, const std::vector<Histogram<kSize>> &, uint8_t *) [DataType = unsigned short, kSize = 520]"
                   );
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)pdVar6 * 0x208;
    uVar7 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    __s = operator_new__(uVar7);
    memset(__s,0,(long)pdVar6 * 0x1040);
    for (i_1 = 0; i_1 < pdVar6; i_1 = i_1 + 1) {
      pvVar8 = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::
               operator[](vec,i_1);
      dVar9 = FastLog2(pvVar8->total_count_ & 0xffffffff);
      *(double *)((long)__s + i_1 * 8) = dVar9;
    }
    j_1 = 0x208;
    sVar4 = j_1;
    while (j_1 = sVar4, j_1 != 0) {
      for (cost = (double *)0x0; sVar4 = j_1 - 1, cost < pdVar6; cost = (double *)((long)cost + 1))
      {
        dVar9 = *(double *)((long)__s + (long)cost * 8);
        pvVar8 = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::
                 operator[](vec,(size_type)cost);
        dVar10 = BitCost((ulong)pvVar8->data_[j_1 - 1]);
        *(double *)((long)__s + (long)((j_1 - 1) * (long)pdVar6 + (long)cost) * 8) = dVar9 - dVar10;
      }
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pdVar6;
    uVar7 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    __s_00 = operator_new__(uVar7);
    memset(__s_00,0,(long)pdVar6 << 3);
    __s_01 = operator_new__(length * (long)pdVar6);
    memset(__s_01,0,length * (long)pdVar6);
    for (ix_1 = 0; ix_1 < length; ix_1 = ix_1 + 1) {
      uVar1 = data[ix_1];
      k = 0x547d42aea2879f2e;
      for (block_switch_cost = 0.0; (ulong)block_switch_cost < pdVar6;
          block_switch_cost = (double)((long)block_switch_cost + 1)) {
        *(double *)((long)__s_00 + (long)block_switch_cost * 8) =
             *(double *)((long)__s + ((ulong)uVar1 * (long)pdVar6 + (long)block_switch_cost) * 8) +
             *(double *)((long)__s_00 + (long)block_switch_cost * 8);
        if (*(double *)((long)__s_00 + (long)block_switch_cost * 8) < (double)k) {
          k = *(size_t *)((long)__s_00 + (long)block_switch_cost * 8);
          block_id[ix_1] = SUB81(block_switch_cost,0);
        }
      }
      k_1 = (size_t)block_switch_bitcost;
      if (ix_1 < 2000) {
        auVar11._8_4_ = (int)(ix_1 >> 0x20);
        auVar11._0_8_ = ix_1;
        auVar11._12_4_ = 0x45300000;
        k_1 = (size_t)(((((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)ix_1) - 4503599627370496.0)) * 0.07) /
                        2000.0 + 0.77) * block_switch_bitcost);
      }
      for (byte_ix = 0; byte_ix < pdVar6; byte_ix = byte_ix + 1) {
        *(double *)((long)__s_00 + byte_ix * 8) =
             *(double *)((long)__s_00 + byte_ix * 8) - (double)k;
        if ((double)k_1 <= *(double *)((long)__s_00 + byte_ix * 8)) {
          *(size_t *)((long)__s_00 + byte_ix * 8) = k_1;
          *(undefined1 *)((long)__s_01 + ix_1 * (long)pdVar6 + byte_ix) = 1;
        }
      }
    }
    ix = length - 1;
    lStack_b8 = ix * (long)pdVar6;
    local_b9 = block_id[ix];
    while (ix != 0) {
      ix = ix - 1;
      lStack_b8 = lStack_b8 - (long)pdVar6;
      if ((*(byte *)((long)__s_01 + lStack_b8 + (ulong)local_b9) & 1) != 0) {
        local_b9 = block_id[ix];
      }
      block_id[ix] = local_b9;
    }
    if (__s != (void *)0x0) {
      operator_delete__(__s);
    }
    if (__s_00 != (void *)0x0) {
      operator_delete__(__s_00);
    }
    if (__s_01 != (void *)0x0) {
      operator_delete__(__s_01);
    }
  }
  return;
}

Assistant:

void FindBlocks(const DataType* data, const size_t length,
                const double block_switch_bitcost,
                const std::vector<Histogram<kSize> > &vec,
                uint8_t *block_id) {
  if (vec.size() <= 1) {
    for (size_t i = 0; i < length; ++i) {
      block_id[i] = 0;
    }
    return;
  }
  size_t vecsize = vec.size();
  assert(vecsize <= 256);
  double* insert_cost = new double[kSize * vecsize];
  memset(insert_cost, 0, sizeof(insert_cost[0]) * kSize * vecsize);
  for (size_t j = 0; j < vecsize; ++j) {
    insert_cost[j] = FastLog2(static_cast<uint32_t>(vec[j].total_count_));
  }
  for (size_t i = kSize; i != 0;) {
    --i;
    for (size_t j = 0; j < vecsize; ++j) {
      insert_cost[i * vecsize + j] = insert_cost[j] - BitCost(vec[j].data_[i]);
    }
  }
  double *cost = new double[vecsize];
  memset(cost, 0, sizeof(cost[0]) * vecsize);
  bool* switch_signal = new bool[length * vecsize];
  memset(switch_signal, 0, sizeof(switch_signal[0]) * length * vecsize);
  // After each iteration of this loop, cost[k] will contain the difference
  // between the minimum cost of arriving at the current byte position using
  // entropy code k, and the minimum cost of arriving at the current byte
  // position. This difference is capped at the block switch cost, and if it
  // reaches block switch cost, it means that when we trace back from the last
  // position, we need to switch here.
  for (size_t byte_ix = 0; byte_ix < length; ++byte_ix) {
    size_t ix = byte_ix * vecsize;
    size_t insert_cost_ix = data[byte_ix] * vecsize;
    double min_cost = 1e99;
    for (size_t k = 0; k < vecsize; ++k) {
      // We are coding the symbol in data[byte_ix] with entropy code k.
      cost[k] += insert_cost[insert_cost_ix + k];
      if (cost[k] < min_cost) {
        min_cost = cost[k];
        block_id[byte_ix] = static_cast<uint8_t>(k);
      }
    }
    double block_switch_cost = block_switch_bitcost;
    // More blocks for the beginning.
    if (byte_ix < 2000) {
      block_switch_cost *= 0.77 + 0.07 * static_cast<double>(byte_ix) / 2000;
    }
    for (size_t k = 0; k < vecsize; ++k) {
      cost[k] -= min_cost;
      if (cost[k] >= block_switch_cost) {
        cost[k] = block_switch_cost;
        switch_signal[ix + k] = true;
      }
    }
  }
  // Now trace back from the last position and switch at the marked places.
  size_t byte_ix = length - 1;
  size_t ix = byte_ix * vecsize;
  uint8_t cur_id = block_id[byte_ix];
  while (byte_ix > 0) {
    --byte_ix;
    ix -= vecsize;
    if (switch_signal[ix + cur_id]) {
      cur_id = block_id[byte_ix];
    }
    block_id[byte_ix] = cur_id;
  }
  delete[] insert_cost;
  delete[] cost;
  delete[] switch_signal;
}